

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# declaration.cc
# Opt level: O0

void __thiscall
tchecker::parsing::location_declaration_t::~location_declaration_t(location_declaration_t *this)

{
  location_declaration_t *this_local;
  
  ~location_declaration_t(this);
  operator_delete(this,0x90);
  return;
}

Assistant:

location_declaration_t::~location_declaration_t() = default;